

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImBezierClosestPoint(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  undefined8 uVar1;
  ImVec2 *in_RCX;
  undefined8 *in_RDI;
  ImVec2 *in_R8;
  int in_R9D;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  float dist2;
  ImVec2 p_line;
  ImVec2 p_current;
  int i_step;
  float t_step;
  float p_closest_dist2;
  ImVec2 p_last;
  ImVec2 p_closest;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  ImVec2 in_stack_ffffffffffffffa8;
  ImVec2 *in_stack_ffffffffffffffb0;
  int iVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImVec2 local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  uVar9 = (undefined4)*in_RDI;
  uVar10 = (undefined4)((ulong)*in_RDI >> 0x20);
  ImVec2::ImVec2(&local_8);
  fVar8 = 3.4028235e+38;
  fVar2 = 1.0 / (float)in_R9D;
  for (iVar7 = 1; iVar7 <= in_R9D; iVar7 = iVar7 + 1) {
    auVar4._0_8_ = ImBezierCalc((ImVec2 *)CONCAT44(in_R9D,uVar10),(ImVec2 *)CONCAT44(uVar9,fVar8),
                                (ImVec2 *)CONCAT44(fVar2,iVar7),in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8.y);
    auVar4._8_56_ = extraout_var;
    in_stack_ffffffffffffffb0 = (ImVec2 *)vmovlpd_avx(auVar4._0_16_);
    auVar5._0_8_ = ImLineClosestPoint(in_RCX,in_R8,(ImVec2 *)CONCAT44(in_R9D,uVar10));
    auVar5._8_56_ = extraout_var_00;
    in_stack_ffffffffffffffa8 = (ImVec2)vmovlpd_avx(auVar5._0_16_);
    auVar6._0_8_ = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                             ,(ImVec2 *)0x41ebcd);
    auVar6._8_56_ = extraout_var_01;
    uVar1 = vmovlpd_avx(auVar6._0_16_);
    in_stack_ffffffffffffff9c = (float)uVar1;
    fVar3 = ImLengthSqr((ImVec2 *)&stack0xffffffffffffff9c);
    if (fVar3 < fVar8) {
      fVar8 = fVar3;
      local_8 = in_stack_ffffffffffffffa8;
    }
    uVar9 = SUB84(in_stack_ffffffffffffffb0,0);
    uVar10 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  }
  return local_8;
}

Assistant:

ImVec2 ImBezierClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}